

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

void Cba_NtkPrintDistrib(Cba_Ntk_t *p,int fVerbose)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  Vec_Wrd_t *p_00;
  Vec_Wrd_t *p_01;
  void *pvVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  undefined4 *__ptr;
  Vec_Ptr_t *vTypes;
  void **ppvVar14;
  Vec_Ptr_t *vOccurs;
  void **ppvVar15;
  undefined8 *puVar16;
  void *pvVar17;
  ulong uVar18;
  char *pcVar19;
  uint uVar20;
  int *piVar21;
  word Entry;
  ulong uVar22;
  char *pcVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  int i;
  double dVar28;
  char *pTypeNames [90];
  void *local_358;
  char *local_308 [91];
  
  __ptr = (undefined4 *)malloc(0x10);
  *__ptr = 0x5a;
  local_358 = calloc(1,0x168);
  *(void **)(__ptr + 2) = local_358;
  __ptr[1] = 0x5a;
  Cba_ManCreatePrimMap(local_308);
  vTypes = (Vec_Ptr_t *)malloc(0x10);
  vTypes->nCap = 0x5a;
  ppvVar14 = (void **)calloc(1,0x2d0);
  vTypes->pArray = ppvVar14;
  vTypes->nSize = 0x5a;
  vOccurs = (Vec_Ptr_t *)malloc(0x10);
  vOccurs->nCap = 0x5a;
  ppvVar15 = (void **)calloc(1,0x2d0);
  vOccurs->pArray = ppvVar15;
  vOccurs->nSize = 0x5a;
  lVar24 = 0;
  do {
    puVar16 = (undefined8 *)malloc(0x10);
    *puVar16 = 0x10;
    pvVar17 = malloc(0x80);
    puVar16[1] = pvVar17;
    ppvVar14[lVar24] = puVar16;
    lVar24 = lVar24 + 1;
  } while (lVar24 != 0x5a);
  lVar24 = 0;
  do {
    puVar16 = (undefined8 *)malloc(0x10);
    *puVar16 = 0x10;
    pvVar17 = malloc(0x80);
    puVar16[1] = pvVar17;
    ppvVar15[lVar24] = puVar16;
    lVar24 = lVar24 + 1;
  } while (lVar24 != 0x5a);
  uVar20 = (p->vObjType).nSize;
  uVar18 = (ulong)uVar20;
  if (1 < (int)uVar20) {
    uVar20 = 0xffffffff;
    uVar27 = 1;
    iVar3 = 0x5a;
    iVar1 = 0;
    do {
      if ((long)(int)uVar18 <= (long)uVar27) {
LAB_003aa0ed:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      bVar2 = (p->vObjType).pArray[uVar27];
      uVar18 = (ulong)bVar2;
      if (bVar2 != 0) {
        iVar8 = (int)uVar27;
        uVar5 = Cba_FonRangeSize(p,iVar8);
        Cba_ObjSigned(p,iVar8);
        if ((int)uVar5 < 0) goto LAB_003aa10c;
        if (0xfffff < uVar5) {
          if (((long)(p->vObjFon0).nSize <= (long)uVar27) ||
             (uVar5 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar27]),
             (long)(p->vObjFon0).nSize <= (long)uVar27)) goto LAB_003aa0ce;
          uVar6 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar27]);
          printf("Object %6d has range %d, which is reduced to %d in the statistics.\n",
                 uVar27 & 0xffffffff,(ulong)uVar5,(ulong)(uVar6 & 0xfffff));
        }
        iVar7 = Cba_ObjLeft(p,iVar8);
        if ((iVar7 != 0) && (iVar7 = Cba_ObjRight(p,iVar8), iVar7 != 0)) {
          if (uVar20 == 0xffffffff) {
            uVar20 = 1;
          }
          iVar1 = iVar1 + 1;
        }
        if ((long)(p->vObjType).nSize <= (long)uVar27) goto LAB_003aa0ed;
        if ((p->vObjType).pArray[uVar27] == '\x01') {
LAB_003a8203:
          iVar7 = Cba_FonRangeSize(p,iVar8);
          iVar8 = Cba_ObjSigned(p,iVar8);
          if (iVar7 < 0) {
LAB_003aa10c:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          Entry = (word)(uint)(iVar8 + iVar7 * 2);
        }
        else {
          if (bVar2 < 0x3a) {
            if ((0x380000200000200U >> (uVar18 & 0x3f) & 1) == 0) {
              if (uVar18 != 8) goto LAB_003a83d9;
              if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
              iVar7 = (p->vObjFin0).pArray[uVar27];
              if ((long)iVar7 < 1) goto LAB_003aa12b;
              if ((p->vFinFon).nSize <= iVar7) goto LAB_003aa0ce;
              if ((p->vFinFon).pArray[iVar7] < 0) goto LAB_003a8203;
            }
LAB_003a8249:
            iVar7 = Cba_FonRangeSize(p,iVar8);
            iVar8 = Cba_ObjSigned(p,iVar8);
            if (iVar7 < 0) goto LAB_003aa10c;
            if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
            piVar21 = (p->vObjFin0).pArray;
LAB_003a827f:
            iVar10 = piVar21[uVar27];
            if ((long)iVar10 < 1) goto LAB_003aa12b;
            if ((p->vFinFon).nSize <= iVar10) goto LAB_003aa0ce;
            iVar10 = (p->vFinFon).pArray[iVar10];
            iVar9 = Cba_FonRangeSize(p,iVar10);
            iVar10 = Cba_ObjSigned(p,iVar10);
            if (iVar9 < 0) goto LAB_003aa10c;
            uVar25 = (ulong)(uint)(iVar10 + iVar9 * 2) << 0x15;
            uVar22 = (ulong)(uint)(iVar8 + iVar7 * 2);
          }
          else {
LAB_003a83d9:
            if (bVar2 == 0x59) goto LAB_003a8203;
            if (0xfffffff9 < bVar2 - 0x21) goto LAB_003a8249;
            if ((long)(p->vObjFin0).nSize <= (long)(uVar27 + 1)) goto LAB_003aa0ce;
            piVar21 = (p->vObjFin0).pArray;
            iVar7 = piVar21[uVar27 + 1] - piVar21[uVar27];
            if (iVar7 == 1) {
              iVar7 = Cba_FonRangeSize(p,iVar8);
              iVar8 = Cba_ObjSigned(p,iVar8);
              if (iVar7 < 0) goto LAB_003aa10c;
              if ((long)uVar27 < (long)(p->vObjFin0).nSize) {
                piVar21 = (p->vObjFin0).pArray;
                goto LAB_003a827f;
              }
              goto LAB_003aa0ce;
            }
            if (iVar7 < 2) {
              __assert_fail("Cba_ObjFinNum(p, i) >= 2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaNtk.c"
                            ,0x82,"void Cba_NtkPrintDistrib(Cba_Ntk_t *, int)");
            }
            iVar7 = Cba_FonRangeSize(p,iVar8);
            iVar8 = Cba_ObjSigned(p,iVar8);
            if (iVar7 < 0) goto LAB_003aa10c;
            if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
            iVar10 = (p->vObjFin0).pArray[uVar27];
            if ((long)iVar10 < 1) goto LAB_003aa12b;
            if ((p->vFinFon).nSize <= iVar10) goto LAB_003aa0ce;
            iVar10 = (p->vFinFon).pArray[iVar10];
            iVar9 = Cba_FonRangeSize(p,iVar10);
            iVar10 = Cba_ObjSigned(p,iVar10);
            if (iVar9 < 0) goto LAB_003aa10c;
            if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
            iVar12 = (p->vObjFin0).pArray[uVar27];
            if (iVar12 < 0) goto LAB_003aa12b;
            uVar5 = iVar12 + 1;
            if ((p->vFinFon).nSize <= (int)uVar5) goto LAB_003aa0ce;
            iVar12 = (p->vFinFon).pArray[uVar5];
            iVar11 = Cba_FonRangeSize(p,iVar12);
            iVar12 = Cba_ObjSigned(p,iVar12);
            if (iVar11 < 0) goto LAB_003aa10c;
            uVar25 = (ulong)(uint)(iVar12 + iVar11 * 2) << 0x2a;
            uVar22 = (ulong)(uint)(iVar8 + iVar7 * 2) | (ulong)(uint)(iVar10 + iVar9 * 2) << 0x15;
          }
          Entry = uVar22 | uVar25;
        }
        uVar5 = (uint)bVar2;
        if ((vTypes->nSize <= (int)uVar5) || (vOccurs->nSize <= (int)uVar5)) goto LAB_003aa0af;
        p_00 = (Vec_Wrd_t *)vTypes->pArray[uVar18];
        p_01 = (Vec_Wrd_t *)vOccurs->pArray[uVar18];
        if (0 < (long)p_00->nSize) {
          lVar24 = 0;
          do {
            if (p_00->pArray[lVar24] == Entry) {
              if (p_01->nSize <= (int)lVar24) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                              ,0x1bf,"word Vec_WrdAddToEntry(Vec_Wrd_t *, int, word)");
              }
              p_01->pArray[lVar24] = p_01->pArray[lVar24] + 1;
              goto code_r0x003a836b;
            }
            lVar24 = lVar24 + 1;
          } while (p_00->nSize != lVar24);
        }
        Vec_WrdPush(p_00,Entry);
        Vec_WrdPush(p_01,1);
code_r0x003a836b:
        switch(uVar5) {
        case 9:
          iVar3 = __ptr[1];
          if (iVar3 < 10) {
LAB_003aa169:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1da,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          break;
        case 10:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar3) goto LAB_003aa0ce;
          iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]);
          iVar3 = __ptr[1];
          if (iVar3 < 0xb) goto LAB_003aa169;
          local_358 = *(void **)(__ptr + 2);
          *(int *)((long)local_358 + 0x28) = *(int *)((long)local_358 + 0x28) + iVar8;
          break;
        case 0xc:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar3) goto LAB_003aa0ce;
          iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]);
          iVar3 = __ptr[1];
          if (iVar3 < 0xd) goto LAB_003aa169;
          local_358 = *(void **)(__ptr + 2);
          *(int *)((long)local_358 + 0x30) = *(int *)((long)local_358 + 0x30) + iVar8;
          break;
        case 0xe:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar3) goto LAB_003aa0ce;
          iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]);
          iVar3 = __ptr[1];
          if (iVar3 < 0xf) goto LAB_003aa169;
          local_358 = *(void **)(__ptr + 2);
          *(int *)((long)local_358 + 0x38) = *(int *)((long)local_358 + 0x38) + iVar8 * 3;
          break;
        case 0x12:
          if (((long)(p->vObjFon0).nSize <= (long)uVar27) ||
             (iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar27]),
             (long)(p->vObjFin0).nSize <= (long)(uVar27 + 1))) goto LAB_003aa0ce;
          iVar3 = __ptr[1];
          if (iVar3 < 0x13) goto LAB_003aa169;
          piVar21 = (p->vObjFin0).pArray;
          local_358 = *(void **)(__ptr + 2);
          *(int *)((long)local_358 + 0x48) =
               *(int *)((long)local_358 + 0x48) +
               iVar8 * ((piVar21[uVar27 + 1] - piVar21[uVar27]) + -2) * 3;
          break;
        case 0x1b:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar3) goto LAB_003aa0ce;
          iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]);
          iVar3 = __ptr[1];
          if (iVar3 < 0x1c) goto LAB_003aa169;
          local_358 = *(void **)(__ptr + 2);
          *(int *)((long)local_358 + 0x6c) = iVar8 + *(int *)((long)local_358 + 0x6c) + -1;
          break;
        case 0x1d:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar3) goto LAB_003aa0ce;
          iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]);
          iVar3 = __ptr[1];
          if (iVar3 < 0x1e) goto LAB_003aa169;
          *(int *)((long)local_358 + 0x74) = iVar8 + *(int *)((long)local_358 + 0x74) + -1;
          break;
        case 0x1f:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar3) goto LAB_003aa0ce;
          iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]);
          iVar3 = __ptr[1];
          if (iVar3 < 0x20) goto LAB_003aa169;
          *(int *)((long)local_358 + 0x7c) = iVar8 * 3 + *(int *)((long)local_358 + 0x7c) + -3;
          break;
        case 0x21:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar3) goto LAB_003aa0ce;
          iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]);
          iVar3 = __ptr[1];
          if (iVar3 < 0x22) goto LAB_003aa169;
          local_358 = *(void **)(__ptr + 2);
          *(int *)((long)local_358 + 0x84) = iVar8 + *(int *)((long)local_358 + 0x84) + -1;
          break;
        case 0x22:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) {
LAB_003aa12b:
            __assert_fail("f>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                          ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
          }
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if (((p->vObjFon0).nSize <= iVar3) ||
             (iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]),
             (long)(p->vObjFin0).nSize <= (long)uVar27)) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if (iVar3 < 0) goto LAB_003aa12b;
          uVar5 = iVar3 + 1;
          if ((p->vFinFon).nSize <= (int)uVar5) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[uVar5];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar3) goto LAB_003aa0ce;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]);
          iVar3 = __ptr[1];
          if (iVar3 < 0x23) goto LAB_003aa169;
          local_358 = *(void **)(__ptr + 2);
          *(int *)((long)local_358 + 0x88) = *(int *)((long)local_358 + 0x88) + iVar8 + iVar7 + -1;
          break;
        case 0x24:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if (((p->vObjFon0).nSize <= iVar3) ||
             (iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]),
             (long)(p->vObjFin0).nSize <= (long)uVar27)) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if (iVar3 < 0) goto LAB_003aa12b;
          uVar5 = iVar3 + 1;
          if ((p->vFinFon).nSize <= (int)uVar5) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[uVar5];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar3) goto LAB_003aa0ce;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]);
          iVar3 = __ptr[1];
          if (iVar3 < 0x25) goto LAB_003aa169;
          local_358 = *(void **)(__ptr + 2);
          *(int *)((long)local_358 + 0x90) = *(int *)((long)local_358 + 0x90) + iVar8 + iVar7 + -1;
          break;
        case 0x26:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if (((p->vObjFon0).nSize <= iVar3) ||
             (iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]),
             (long)(p->vObjFin0).nSize <= (long)uVar27)) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if (iVar3 < 0) goto LAB_003aa12b;
          uVar5 = iVar3 + 1;
          if ((p->vFinFon).nSize <= (int)uVar5) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[uVar5];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar3) goto LAB_003aa0ce;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]);
          iVar3 = __ptr[1];
          if (iVar3 < 0x27) goto LAB_003aa169;
          local_358 = *(void **)(__ptr + 2);
          *(int *)((long)local_358 + 0x98) = *(int *)((long)local_358 + 0x98) + iVar8 + iVar7 + 1;
          break;
        case 0x2f:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar3) goto LAB_003aa0ce;
          iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]);
          iVar3 = __ptr[1];
          if (iVar3 < 0x30) goto LAB_003aa169;
          *(int *)((long)local_358 + 0xbc) = *(int *)((long)local_358 + 0xbc) + iVar8 * 9;
          break;
        case 0x30:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar3) goto LAB_003aa0ce;
          iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]);
          iVar3 = __ptr[1];
          if (iVar3 < 0x31) goto LAB_003aa169;
          *(int *)((long)local_358 + 0xc0) = *(int *)((long)local_358 + 0xc0) + iVar8 * 9;
          break;
        case 0x31:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar8 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar8 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar8) goto LAB_003aa0ce;
          iVar8 = (p->vFinFon).pArray[iVar8];
          if ((long)iVar8 < 1) goto LAB_003aa14a;
          if (((p->vObjFon0).nSize <= iVar8) ||
             (iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar8]),
             (long)(p->vObjFin0).nSize <= (long)uVar27)) goto LAB_003aa0ce;
          iVar7 = (p->vObjFin0).pArray[uVar27];
          if (iVar7 < 0) goto LAB_003aa12b;
          uVar5 = iVar7 + 1;
          if ((p->vFinFon).nSize <= (int)uVar5) goto LAB_003aa0ce;
          iVar7 = (p->vFinFon).pArray[uVar5];
          if ((long)iVar7 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar7) goto LAB_003aa0ce;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]);
          if (iVar3 < 0x32) goto LAB_003aa169;
          *(int *)((long)local_358 + 0xc4) = *(int *)((long)local_358 + 0xc4) + iVar8 * 9 * iVar7;
          break;
        case 0x33:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar8 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar8 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar8) goto LAB_003aa0ce;
          iVar8 = (p->vFinFon).pArray[iVar8];
          if ((long)iVar8 < 1) goto LAB_003aa14a;
          if (((p->vObjFon0).nSize <= iVar8) ||
             (iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar8]),
             (long)(p->vObjFin0).nSize <= (long)uVar27)) goto LAB_003aa0ce;
          iVar7 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar7 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003aa0ce;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003aa14a;
          if (((p->vObjFon0).nSize <= iVar7) ||
             (iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]),
             (long)(p->vObjFin0).nSize <= (long)uVar27)) goto LAB_003aa0ce;
          iVar10 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar10 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar10) goto LAB_003aa0ce;
          iVar10 = (p->vFinFon).pArray[iVar10];
          if ((long)iVar10 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar10) goto LAB_003aa0ce;
          iVar10 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar10]);
          if (iVar3 < 0x34) goto LAB_003aa169;
          *(int *)((long)local_358 + 0xcc) =
               iVar10 * -0x13 + iVar8 * 0xd * iVar7 + *(int *)((long)local_358 + 0xcc) + 10;
          break;
        case 0x34:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar8 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar8 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar8) goto LAB_003aa0ce;
          iVar8 = (p->vFinFon).pArray[iVar8];
          if ((long)iVar8 < 1) goto LAB_003aa14a;
          if (((p->vObjFon0).nSize <= iVar8) ||
             (iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar8]),
             (long)(p->vObjFin0).nSize <= (long)uVar27)) goto LAB_003aa0ce;
          iVar7 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar7 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003aa0ce;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003aa14a;
          if (((p->vObjFon0).nSize <= iVar7) ||
             (iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]),
             (long)(p->vObjFin0).nSize <= (long)uVar27)) goto LAB_003aa0ce;
          iVar10 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar10 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar10) goto LAB_003aa0ce;
          iVar10 = (p->vFinFon).pArray[iVar10];
          if ((long)iVar10 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar10) goto LAB_003aa0ce;
          iVar10 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar10]);
          if (iVar3 < 0x35) goto LAB_003aa169;
          *(int *)((long)local_358 + 0xd0) =
               iVar10 * -7 + iVar8 * 0xd * iVar7 + *(int *)((long)local_358 + 0xd0) + -2;
          break;
        case 0x36:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar8 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar8 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar8) goto LAB_003aa0ce;
          iVar8 = (p->vFinFon).pArray[iVar8];
          if ((long)iVar8 < 1) goto LAB_003aa14a;
          if (((p->vObjFon0).nSize <= iVar8) ||
             (iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar8]),
             (long)(p->vObjFin0).nSize <= (long)uVar27)) goto LAB_003aa0ce;
          iVar7 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar7 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003aa0ce;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar7) goto LAB_003aa0ce;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]);
          dVar28 = pow((double)iVar8,(double)iVar7);
          if (iVar3 < 0x37) goto LAB_003aa169;
          *(int *)((long)local_358 + 0xd8) = *(int *)((long)local_358 + 0xd8) + (int)dVar28 * 10;
          break;
        case 0x37:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar8 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar8 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar8) goto LAB_003aa0ce;
          iVar8 = (p->vFinFon).pArray[iVar8];
          if ((long)iVar8 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar8) goto LAB_003aa0ce;
          iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar8]);
          if (iVar3 < 0x38) goto LAB_003aa169;
          *(int *)((long)local_358 + 0xdc) = *(int *)((long)local_358 + 0xdc) + iVar8 * 4;
          break;
        case 0x38:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar8 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar8 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar8) goto LAB_003aa0ce;
          iVar8 = (p->vFinFon).pArray[iVar8];
          if ((long)iVar8 < 1) goto LAB_003aa14a;
          if (((p->vObjFon0).nSize <= iVar8) ||
             (iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar8]),
             (long)(p->vObjFin0).nSize <= (long)uVar27)) goto LAB_003aa0ce;
          iVar7 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar7 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003aa0ce;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar7) goto LAB_003aa0ce;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]);
          iVar7 = iVar7 * iVar8 * 0xb;
          iVar8 = iVar7 + 7;
          if (-1 < iVar7) {
            iVar8 = iVar7;
          }
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar7 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar7 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar7) goto LAB_003aa0ce;
          iVar7 = (p->vFinFon).pArray[iVar7];
          if ((long)iVar7 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar7) goto LAB_003aa0ce;
          iVar7 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar7]);
          if (iVar3 < 0x39) goto LAB_003aa169;
          *(int *)((long)local_358 + 0xe0) =
               *(int *)((long)local_358 + 0xe0) + (iVar7 * 5) / 2 + (iVar8 >> 3) + -5;
          break;
        case 0x3b:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar3) goto LAB_003aa0ce;
          iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]);
          iVar3 = __ptr[1];
          if (iVar3 < 0x3c) goto LAB_003aa169;
          local_358 = *(void **)(__ptr + 2);
          *(int *)((long)local_358 + 0xec) = *(int *)((long)local_358 + 0xec) + iVar8 * 6 + -6;
          break;
        case 0x3c:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar3) goto LAB_003aa0ce;
          iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]);
          iVar3 = __ptr[1];
          if (iVar3 < 0x3d) goto LAB_003aa169;
          local_358 = *(void **)(__ptr + 2);
          *(int *)((long)local_358 + 0xf0) = *(int *)((long)local_358 + 0xf0) + iVar8 * 6 + -6;
          break;
        case 0x3d:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar3) goto LAB_003aa0ce;
          iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]);
          iVar3 = __ptr[1];
          if (iVar3 < 0x3e) goto LAB_003aa169;
          local_358 = *(void **)(__ptr + 2);
          *(int *)((long)local_358 + 0xf4) = *(int *)((long)local_358 + 0xf4) + iVar8 * 6 + -6;
          break;
        case 0x3e:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar3) goto LAB_003aa0ce;
          iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]);
          iVar3 = __ptr[1];
          if (iVar3 < 0x3f) goto LAB_003aa169;
          local_358 = *(void **)(__ptr + 2);
          *(int *)((long)local_358 + 0xf8) = *(int *)((long)local_358 + 0xf8) + iVar8 * 6 + -6;
          break;
        case 0x3f:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar3) goto LAB_003aa0ce;
          iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]);
          iVar3 = __ptr[1];
          if (iVar3 < 0x40) goto LAB_003aa169;
          local_358 = *(void **)(__ptr + 2);
          *(int *)((long)local_358 + 0xfc) = *(int *)((long)local_358 + 0xfc) + iVar8 * 4 + -1;
          break;
        case 0x40:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if ((p->vObjFon0).nSize <= iVar3) goto LAB_003aa0ce;
          iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]);
          iVar3 = __ptr[1];
          if (iVar3 < 0x41) goto LAB_003aa169;
          local_358 = *(void **)(__ptr + 2);
          *(int *)((long)local_358 + 0x100) = *(int *)((long)local_358 + 0x100) + iVar8 * 4 + -1;
          break;
        case 0x41:
          if (((long)(p->vObjFon0).nSize <= (long)uVar27) ||
             (iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar27]),
             (long)(p->vObjFin0).nSize <= (long)uVar27)) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if (((p->vObjFon0).nSize <= iVar3) ||
             (uVar5 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]),
             (long)(p->vObjFon0).nSize <= (long)uVar27)) goto LAB_003aa0ce;
          uVar6 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar27]);
          iVar3 = __ptr[1];
          if (iVar3 < 0x42) goto LAB_003aa169;
          uVar13 = 0x1f;
          if (uVar6 - 1 != 0) {
            for (; uVar6 - 1 >> uVar13 == 0; uVar13 = uVar13 - 1) {
            }
          }
          uVar13 = (uVar13 ^ 0xffffffe0) + 0x21;
          if (uVar6 < 2) {
            uVar13 = uVar6;
          }
          if ((int)uVar5 < (int)uVar13) {
            uVar13 = uVar5;
          }
          local_358 = *(void **)(__ptr + 2);
          *(int *)((long)local_358 + 0x104) = *(int *)((long)local_358 + 0x104) + iVar8 * uVar13 * 3
          ;
          break;
        case 0x42:
          if ((long)(p->vObjFin0).nSize <= (long)uVar27) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if (((p->vObjFon0).nSize <= iVar3) ||
             (uVar5 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]),
             (long)(p->vObjFon0).nSize <= (long)uVar27)) goto LAB_003aa0ce;
          uVar6 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar27]);
          iVar3 = __ptr[1];
          if (iVar3 < 0x43) goto LAB_003aa169;
          uVar13 = 0x1f;
          if (uVar6 - 1 != 0) {
            for (; uVar6 - 1 >> uVar13 == 0; uVar13 = uVar13 - 1) {
            }
          }
          uVar13 = (uVar13 ^ 0xffffffe0) + 0x21;
          if (uVar6 < 2) {
            uVar13 = uVar6;
          }
          if ((int)uVar5 < (int)uVar13) {
            uVar13 = uVar5;
          }
          local_358 = *(void **)(__ptr + 2);
          *(int *)((long)local_358 + 0x108) = *(int *)((long)local_358 + 0x108) + uVar13 * 3;
          break;
        case 0x43:
          if (((long)(p->vObjFon0).nSize <= (long)uVar27) ||
             (iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar27]),
             (long)(p->vObjFin0).nSize <= (long)uVar27)) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if (((p->vObjFon0).nSize <= iVar3) ||
             (uVar5 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]),
             (long)(p->vObjFon0).nSize <= (long)uVar27)) goto LAB_003aa0ce;
          uVar6 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar27]);
          iVar3 = __ptr[1];
          if (iVar3 < 0x44) goto LAB_003aa169;
          uVar13 = 0x1f;
          if (uVar6 - 1 != 0) {
            for (; uVar6 - 1 >> uVar13 == 0; uVar13 = uVar13 - 1) {
            }
          }
          uVar13 = (uVar13 ^ 0xffffffe0) + 0x21;
          if (uVar6 < 2) {
            uVar13 = uVar6;
          }
          if ((int)uVar5 < (int)uVar13) {
            uVar13 = uVar5;
          }
          local_358 = *(void **)(__ptr + 2);
          *(int *)((long)local_358 + 0x10c) = *(int *)((long)local_358 + 0x10c) + iVar8 * uVar13 * 3
          ;
          break;
        case 0x44:
          if (((long)(p->vObjFon0).nSize <= (long)uVar27) ||
             (iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar27]),
             (long)(p->vObjFin0).nSize <= (long)uVar27)) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if (((p->vObjFon0).nSize <= iVar3) ||
             (uVar5 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]),
             (long)(p->vObjFon0).nSize <= (long)uVar27)) goto LAB_003aa0ce;
          uVar6 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar27]);
          iVar3 = __ptr[1];
          if (iVar3 < 0x45) goto LAB_003aa169;
          uVar13 = 0x1f;
          if (uVar6 - 1 != 0) {
            for (; uVar6 - 1 >> uVar13 == 0; uVar13 = uVar13 - 1) {
            }
          }
          uVar13 = (uVar13 ^ 0xffffffe0) + 0x21;
          if (uVar6 < 2) {
            uVar13 = uVar6;
          }
          if ((int)uVar5 < (int)uVar13) {
            uVar13 = uVar5;
          }
          local_358 = *(void **)(__ptr + 2);
          *(int *)((long)local_358 + 0x110) = *(int *)((long)local_358 + 0x110) + iVar8 * uVar13 * 3
          ;
          break;
        case 0x45:
          if (((long)(p->vObjFon0).nSize <= (long)uVar27) ||
             (iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar27]),
             (long)(p->vObjFin0).nSize <= (long)uVar27)) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if (((p->vObjFon0).nSize <= iVar3) ||
             (uVar5 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]),
             (long)(p->vObjFon0).nSize <= (long)uVar27)) goto LAB_003aa0ce;
          uVar6 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar27]);
          iVar3 = __ptr[1];
          if (iVar3 < 0x46) goto LAB_003aa169;
          uVar13 = 0x1f;
          if (uVar6 - 1 != 0) {
            for (; uVar6 - 1 >> uVar13 == 0; uVar13 = uVar13 - 1) {
            }
          }
          uVar13 = (uVar13 ^ 0xffffffe0) + 0x21;
          if (uVar6 < 2) {
            uVar13 = uVar6;
          }
          if ((int)uVar5 < (int)uVar13) {
            uVar13 = uVar5;
          }
          local_358 = *(void **)(__ptr + 2);
          *(int *)((long)local_358 + 0x114) = *(int *)((long)local_358 + 0x114) + iVar8 * uVar13 * 3
          ;
          break;
        case 0x46:
          if (((long)(p->vObjFon0).nSize <= (long)uVar27) ||
             (iVar8 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar27]),
             (long)(p->vObjFin0).nSize <= (long)uVar27)) goto LAB_003aa0ce;
          iVar3 = (p->vObjFin0).pArray[uVar27];
          if ((long)iVar3 < 1) goto LAB_003aa12b;
          if ((p->vFinFon).nSize <= iVar3) goto LAB_003aa0ce;
          iVar3 = (p->vFinFon).pArray[iVar3];
          if ((long)iVar3 < 1) goto LAB_003aa14a;
          if (((p->vObjFon0).nSize <= iVar3) ||
             (uVar5 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[iVar3]),
             (long)(p->vObjFon0).nSize <= (long)uVar27)) goto LAB_003aa0ce;
          uVar6 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar27]);
          iVar3 = __ptr[1];
          if (iVar3 < 0x47) goto LAB_003aa169;
          uVar13 = 0x1f;
          if (uVar6 - 1 != 0) {
            for (; uVar6 - 1 >> uVar13 == 0; uVar13 = uVar13 - 1) {
            }
          }
          uVar13 = (uVar13 ^ 0xffffffe0) + 0x21;
          if (uVar6 < 2) {
            uVar13 = uVar6;
          }
          if ((int)uVar5 < (int)uVar13) {
            uVar13 = uVar5;
          }
          local_358 = *(void **)(__ptr + 2);
          *(int *)((long)local_358 + 0x118) = *(int *)((long)local_358 + 0x118) + iVar8 * uVar13 * 3
          ;
          break;
        case 0x58:
          iVar3 = __ptr[1];
          if (iVar3 < 0x59) goto LAB_003aa169;
          break;
        case 0x59:
          iVar3 = __ptr[1];
          if (iVar3 < 0x5a) goto LAB_003aa169;
        }
      }
      uVar27 = uVar27 + 1;
      uVar18 = (ulong)(p->vObjType).nSize;
    } while ((long)uVar27 < (long)uVar18);
    if (iVar1 != 0) {
      printf("Warning: %d objects of the design have non-zero-based ranges.\n");
      if ((int)uVar20 < 1) {
LAB_003aa14a:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                      ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
      }
      if ((p->vObjFon0).nSize <= (int)uVar20) {
LAB_003aa0ce:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((p->vFonName).nSize < 1) {
        pcVar19 = "Cba_NtkHasFonNames(p)";
LAB_003aa1b7:
        __assert_fail(pcVar19,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                      ,0x11e,"char *Cba_FonNameStr(Cba_Ntk_t *, int)");
      }
      uVar5 = (p->vObjFon0).pArray[uVar20];
      if ((int)uVar5 < 1) {
        pcVar19 = "Cba_FonIsReal(f)";
        goto LAB_003aa1b7;
      }
      Vec_IntFillExtra(&p->vFonName,uVar5 + 1,0);
      if (((p->vFonName).nSize <= (int)uVar5) ||
         (pcVar19 = Abc_NamStr(p->pDesign->pStrs,(p->vFonName).pArray[uVar5]),
         (p->vObjFon0).nSize <= (int)uVar20)) goto LAB_003aa0ce;
      uVar5 = Cba_FonRangeSize(p,(p->vObjFon0).pArray[uVar20]);
      uVar6 = Cba_ObjLeft(p,uVar20);
      uVar13 = Cba_ObjRight(p,uVar20);
      printf("In particular, object %6d with name \"%s\" has range %d=[%d:%d]\n",(ulong)uVar20,
             pcVar19,(ulong)uVar5,(ulong)uVar6,(ulong)uVar13);
    }
  }
  puts("ID  :  name  occurrence    and2 (occurrence)<output_range>=<input_range>.<input_range> ...")
  ;
  uVar20 = vTypes->nSize;
  uVar18 = 0;
  if (0 < (int)uVar20) {
    uVar18 = (ulong)uVar20;
  }
  pcVar19 = "-";
  uVar27 = 0;
  do {
    if ((uVar27 == uVar18) || (uVar5 = vOccurs->nSize, (long)(int)uVar5 <= (long)uVar27)) {
LAB_003aa0af:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    ppvVar14 = vTypes->pArray;
    ppvVar15 = vOccurs->pArray;
    uVar6 = p->pDesign->nObjs[uVar27];
    if (uVar6 != 0) {
      if ((long)(int)__ptr[1] <= (long)uVar27) goto LAB_003aa0ce;
      pvVar17 = ppvVar14[uVar27];
      pvVar4 = ppvVar15[uVar27];
      printf("%2d  :  %-8s  %6d%8d ",uVar27 & 0xffffffff,local_308[uVar27],(ulong)uVar6,
             (ulong)*(uint *)(*(long *)(__ptr + 2) + uVar27 * 4));
      Cba_NtkPrintDistribSortOne(vTypes,vOccurs,(int)uVar27);
      if (0 < *(int *)((long)pvVar17 + 4)) {
        uVar25 = 0;
        do {
          uVar22 = *(ulong *)(*(long *)((long)pvVar17 + 8) + uVar25 * 8);
          if ((((int)(uVar25 / 6) * 6 + 5U == (uint)uVar25) && (0x3ffffffffff < uVar22)) ||
             (((~(uint)uVar25 & 7) == 0 && (uVar22 < 0x40000000000)))) {
            printf("\n                                ");
          }
          if ((long)*(int *)((long)pvVar4 + 4) <= (long)uVar25) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                          ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
          }
          uVar26 = uVar22 >> 0x15;
          printf("(%d)",(ulong)*(uint *)(*(long *)((long)pvVar4 + 8) + uVar25 * 8));
          pcVar23 = pcVar19;
          if ((uVar22 & 1) == 0) {
            pcVar23 = "";
          }
          printf("%s%d",pcVar23,(ulong)((uint)(uVar22 >> 1) & 0xfffff));
          if ((uVar26 & 0x1fffff) != 0) {
            pcVar23 = pcVar19;
            if ((uVar26 & 1) == 0) {
              pcVar23 = "";
            }
            printf("=%s%d",pcVar23,(ulong)(((uint)uVar26 & 0x1fffff) >> 1));
          }
          if (0x3ffffffffff < uVar22) {
            pcVar23 = pcVar19;
            if ((uVar22 >> 0x2a & 1) == 0) {
              pcVar23 = "";
            }
            printf(".%s%d",pcVar23,uVar22 >> 0x2b);
          }
          putchar(0x20);
          uVar25 = uVar25 + 1;
        } while ((long)uVar25 < (long)*(int *)((long)pvVar17 + 4));
      }
      putchar(10);
    }
    uVar27 = uVar27 + 1;
  } while (uVar27 != 0x5a);
  if ((int)uVar20 < 1) {
    if (ppvVar14 == (void **)0x0) goto LAB_003aa01b;
  }
  else {
    uVar18 = 0;
    do {
      pvVar17 = ppvVar14[uVar18];
      if (pvVar17 != (void *)0x0) {
        if (*(void **)((long)pvVar17 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar17 + 8));
        }
        free(pvVar17);
      }
      uVar18 = uVar18 + 1;
    } while (uVar20 != uVar18);
  }
  free(ppvVar14);
LAB_003aa01b:
  free(vTypes);
  uVar18 = 0;
  do {
    pvVar17 = ppvVar15[uVar18];
    if (pvVar17 != (void *)0x0) {
      if (*(void **)((long)pvVar17 + 8) != (void *)0x0) {
        free(*(void **)((long)pvVar17 + 8));
      }
      free(pvVar17);
    }
    uVar18 = uVar18 + 1;
  } while (uVar5 != uVar18);
  free(ppvVar15);
  free(vOccurs);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  return;
}

Assistant:

void Cba_NtkPrintDistrib( Cba_Ntk_t * p, int fVerbose )
{
    Vec_Ptr_t * vTypes, * vOccurs;
    Vec_Int_t * vAnds = Vec_IntStart( CBA_BOX_LAST );
    int iRnObj = -1, nCountRange = 0;
    int i, k, s, s0, s1;  word Sign;
    Cba_ObjType_t Type;
    char * pTypeNames[CBA_BOX_LAST];
    Cba_ManCreatePrimMap( pTypeNames );
    // allocate statistics arrays
    vTypes  = Vec_PtrStart( CBA_BOX_LAST );
    vOccurs = Vec_PtrStart( CBA_BOX_LAST );
    for ( i = 0; i < CBA_BOX_LAST; i++ )
        Vec_PtrWriteEntry( vTypes, i, Vec_WrdAlloc(16) );
    for ( i = 0; i < CBA_BOX_LAST; i++ )
        Vec_PtrWriteEntry( vOccurs, i, Vec_WrdAlloc(16) );
    // add nodes
    Cba_NtkForEachObj( p, i )
    {
//        char * pName = Cba_ObjName(p, i);
        Type = Cba_ObjType( p, i );
        if ( Cba_ObjSign(p, i) > 0x1FFFFF )
            printf( "Object %6d has range %d, which is reduced to %d in the statistics.\n", 
                i, Cba_ObjRangeSize(p, i), Cba_ObjRangeSize(p, i) & 0xFFFFF );
        if ( Cba_ObjLeft(p, i) && Cba_ObjRight(p, i) )
        {
            if ( iRnObj == -1 )
                iRnObj = 1;
            nCountRange++;
        }
        // 0-input types
        if ( Cba_ObjIsPi(p, i) || (Type == CBA_BOX_BUF && Cba_FonIsConst(Cba_ObjFinFon(p, i, 0))) || Type == CBA_BOX_CONCAT )
            Sign = Cba_NtkPrintDistribMakeSign( Cba_ObjSign(p, i), 0, 0 );
        // 1-input types
        else if ( Cba_TypeIsUnary(Type)  )
            Sign = Cba_NtkPrintDistribMakeSign( Cba_ObjSign(p, i), Cba_ObjSign(p, Cba_ObjFinFon(p, i, 0)), 0 );
        // 2-input types (including MUX)
        else if ( Cba_ObjFinNum(p, i) == 1 )
            Sign = Cba_NtkPrintDistribMakeSign( Cba_ObjSign(p, i), Cba_ObjSign(p, Cba_ObjFinFon(p, i, 0)), 0 );
        else
        {
            assert( Cba_ObjFinNum(p, i) >= 2 );
            Sign = Cba_NtkPrintDistribMakeSign( Cba_ObjSign(p, i), Cba_ObjSign(p, Cba_ObjFinFon(p, i, 0)), Cba_ObjSign(p, Cba_ObjFinFon(p, i, 1)) );
        }
        // add to storage
        Cba_NtkPrintDistribAddOne( vTypes, vOccurs, Type, Sign );
        // count the number of AIG nodes
        if ( Type == CBA_BOX_MUX )
            Vec_IntAddToEntry( vAnds, CBA_BOX_MUX,      3 * Cba_ObjRangeSize(p, i) * (Cba_ObjFinNum(p, i) - 2) );
        else if ( Type == CBA_BOX_SHIR )      
            Vec_IntAddToEntry( vAnds, CBA_BOX_SHIR,  Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_SHIRA )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_SHIRA, Cba_ObjRangeSize(p, i) * Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_SHIL )      
            Vec_IntAddToEntry( vAnds, CBA_BOX_SHIL,  Cba_ObjRangeSize(p, i) * Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_SHILA )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_SHILA, Cba_ObjRangeSize(p, i) * Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_ROTR )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_ROTR,  Cba_ObjRangeSize(p, i) * Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_ROTL )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_ROTL,  Cba_ObjRangeSize(p, i) * Abc_MinInt(Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)), Abc_Base2Log(Cba_ObjRangeSize(p, i))) * 3 );
        else if ( Type == CBA_BOX_INV )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_INV, 0 );
        else if ( Type == CBA_BOX_AND )      
            Vec_IntAddToEntry( vAnds, CBA_BOX_AND,         Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_OR )       
            Vec_IntAddToEntry( vAnds, CBA_BOX_OR,          Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_XOR )      
            Vec_IntAddToEntry( vAnds, CBA_BOX_XOR,     3 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_SLICE )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_SLICE, 0 );
        else if ( Type == CBA_BOX_CONCAT )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_CONCAT, 0 );
        else if ( Type == CBA_BOX_LNOT )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_LNOT,        Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 1 );
        else if ( Type == CBA_BOX_LAND )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_LAND,        Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) + Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 1)) - 1 );
        else if ( Type == CBA_BOX_LOR )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_LOR,         Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) + Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 1)) - 1 );
        else if ( Type == CBA_BOX_LXOR )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_LXOR,        Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) + Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 1)) + 1 );
        else if ( Type == CBA_BOX_EQU )     
            Vec_IntAddToEntry( vAnds, CBA_BOX_EQU,      4 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 1 );
        else if ( Type == CBA_BOX_NEQU )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_NEQU,     4 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 1 );
        else if ( Type == CBA_BOX_LTHAN )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_LTHAN,    6 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 6 );
        else if ( Type == CBA_BOX_MTHAN )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_MTHAN,    6 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 6 );
        else if ( Type == CBA_BOX_LETHAN ) 
            Vec_IntAddToEntry( vAnds, CBA_BOX_LETHAN,   6 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 6 );
        else if ( Type == CBA_BOX_METHAN ) 
            Vec_IntAddToEntry( vAnds, CBA_BOX_METHAN,   6 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 6 );
        else if ( Type == CBA_BOX_RAND )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_RAND,         Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 1 );
        else if ( Type == CBA_BOX_ROR )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_ROR,          Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 1 );
        else if ( Type == CBA_BOX_RXOR )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_RXOR,     3 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 3 );
        else if ( Type == CBA_BOX_ADD )       
            Vec_IntAddToEntry( vAnds, CBA_BOX_ADD,      9 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_SUB )       
            Vec_IntAddToEntry( vAnds, CBA_BOX_SUB,      9 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_MUL )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_MUL,      9 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 1)) );
        else if ( Type == CBA_BOX_DIV )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_DIV,     13 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 19 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) + 10 );
        else if ( Type == CBA_BOX_MOD )  
            Vec_IntAddToEntry( vAnds, CBA_BOX_MOD,     13 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 7 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) - 2  );
        else if ( Type == CBA_BOX_POW ) 
            Vec_IntAddToEntry( vAnds, CBA_BOX_POW,     10 * (int)pow((double)Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)),(double)Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0))) );
        else if ( Type == CBA_BOX_MIN )   
            Vec_IntAddToEntry( vAnds, CBA_BOX_MIN,      4 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) );
        else if ( Type == CBA_BOX_SQRT )    
            Vec_IntAddToEntry( vAnds, CBA_BOX_SQRT,    11 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) / 8 + 5 * Cba_ObjRangeSize(p, Cba_ObjFinFon(p, i, 0)) / 2 - 5  );
    }
    if ( nCountRange )
    {
        printf( "Warning: %d objects of the design have non-zero-based ranges.\n", nCountRange );
        printf( "In particular, object %6d with name \"%s\" has range %d=[%d:%d]\n", 
            iRnObj, Cba_FonNameStr(p, Cba_ObjFon0(p, iRnObj)), 
            Cba_ObjRangeSize(p, iRnObj), Cba_ObjLeft(p, iRnObj), Cba_ObjRight(p, iRnObj) );
    }
    // print by occurrence
    printf( "ID  :  name  occurrence    and2 (occurrence)<output_range>=<input_range>.<input_range> ...\n" );
    for ( i = 0; i < CBA_BOX_LAST; i++ )
    {
        Vec_Wrd_t * vType  = (Vec_Wrd_t *)Vec_PtrEntry( vTypes, i );
        Vec_Wrd_t * vOccur = (Vec_Wrd_t *)Vec_PtrEntry( vOccurs, i );
        if ( p->pDesign->nObjs[i] == 0 )
            continue;
        printf( "%2d  :  %-8s  %6d%8d ", i, pTypeNames[i], p->pDesign->nObjs[i], Vec_IntEntry(vAnds, i) );
        // sort by occurence
        Cba_NtkPrintDistribSortOne( vTypes, vOccurs, i );
        Vec_WrdForEachEntry( vType, Sign, k )
        {
            Cba_NtkPrintDistribFromSign( Sign, &s, &s0, &s1 );
            if ( ((k % 6) == 5 && s1) || ((k % 8) == 7 && !s1) )
                printf( "\n                                " );
            printf( "(%d)", (int)Vec_WrdEntry( vOccur, k ) );
            printf( "%s%d",      Abc_LitIsCompl(s)?"-":"",  Abc_Lit2Var(s) );
            if ( s0 )
                printf( "=%s%d", Abc_LitIsCompl(s0)?"-":"", Abc_Lit2Var(s0) );
            if ( s1 )
                printf( ".%s%d", Abc_LitIsCompl(s1)?"-":"", Abc_Lit2Var(s1) );
            printf( " " );
        }
        printf( "\n" );
    }
    Vec_VecFree( (Vec_Vec_t *)vTypes );
    Vec_VecFree( (Vec_Vec_t *)vOccurs );
    Vec_IntFree( vAnds );
}